

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpo.h
# Opt level: O3

bool __thiscall
lpo::
program_options<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::has_opt(program_options<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,string *name,string *short_name)

{
  bool bVar1;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __it;
  _Rb_tree_header *p_Var2;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var3;
  string *local_28;
  string *local_20;
  
  __it._M_node = (this->m_check_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->m_check_list)._M_t._M_impl.super__Rb_tree_header;
  _Var3._M_node = __it._M_node;
  local_28 = name;
  local_20 = short_name;
  while (((_Rb_tree_header *)__it._M_node != p_Var2 &&
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<lpo::program_options<int,double,std::__cxx11::string>::has_opt(std::__cxx11::string_const&,std::__cxx11::string_const&)const::{lambda(auto:1_const&)#1}>
                  ::operator()((_Iter_pred<lpo::program_options<int,double,std::__cxx11::string>::has_opt(std::__cxx11::string_const&,std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                                *)&local_28,__it), _Var3._M_node = __it._M_node, !bVar1))) {
    __it._M_node = (_Base_ptr)std::_Rb_tree_increment(__it._M_node);
    _Var3._M_node = &p_Var2->_M_header;
  }
  return (_Rb_tree_header *)_Var3._M_node != p_Var2;
}

Assistant:

bool
  has_opt(const std::string & name, const std::string & short_name) const
  {
    return std::any_of(std::cbegin(m_check_list), std::cend(m_check_list), [&](const auto & n) {
      return (name == n.first || (!short_name.empty() && short_name == n.second));
    });
  }